

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcMem.c
# Opt level: O0

void Wlc_NtkAbsCreateLogic
               (Wlc_Ntk_t *pNew,Wlc_Ntk_t *p,Vec_Int_t *vNodeFrames,Vec_Int_t *vFanins,
               Vec_Int_t *vNewObjs,Vec_Wec_t *vConstrs,Wlc_Obj_t *pConstrOut)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  Vec_Int_t *p_00;
  Vec_Int_t *p_01;
  Vec_Int_t *p_02;
  Wlc_Obj_t *pWVar6;
  Wlc_Obj_t *pWVar7;
  Wlc_Obj_t *pWVar8;
  int iFrameThis;
  int iFrameLast;
  int Index [2];
  int Entry;
  int k;
  int i;
  Wlc_Obj_t *pConstr;
  Wlc_Obj_t *pCond;
  Wlc_Obj_t *pDatas [2];
  Wlc_Obj_t *pAddrs [2];
  Vec_Int_t *vLevConstr;
  Vec_Int_t *vBitConstr;
  Vec_Int_t *vTrace;
  Vec_Wec_t *vConstrs_local;
  Vec_Int_t *vNewObjs_local;
  Vec_Int_t *vFanins_local;
  Vec_Int_t *vNodeFrames_local;
  Wlc_Ntk_t *p_local;
  Wlc_Ntk_t *pNew_local;
  
  p_00 = Vec_IntAlloc(100);
  p_01 = Vec_IntAlloc(100);
  iVar1 = Vec_IntSize(vNewObjs);
  iVar2 = Vec_IntSize(vNodeFrames);
  if (iVar1 != iVar2 * 2) {
    __assert_fail("Vec_IntSize(vNewObjs) == 2 * Vec_IntSize(vNodeFrames)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlcMem.c"
                  ,0x19f,
                  "void Wlc_NtkAbsCreateLogic(Wlc_Ntk_t *, Wlc_Ntk_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Wec_t *, Wlc_Obj_t *)"
                 );
  }
  Entry = 0;
  do {
    iVar1 = Vec_WecSize(vConstrs);
    if (iVar1 <= Entry) {
      iVar1 = Vec_IntSize(p_00);
      if (iVar1 < 1) {
        iVar1 = Wlc_ObjAlloc(pNew,6,0,0,0);
        _k = Wlc_NtkObj(pNew,iVar1);
        Vec_IntFill(vFanins,1,0);
        Wlc_ObjAddFanins(pNew,_k,vFanins);
      }
      else {
        iVar1 = Vec_IntSize(p_00);
        iVar1 = Wlc_ObjAlloc(pNew,0x17,0,iVar1 + -1,0);
        pWVar8 = Wlc_NtkObj(pNew,iVar1);
        Wlc_ObjAddFanins(pNew,pWVar8,p_00);
        iVar1 = Wlc_ObjId(pNew,pWVar8);
        Vec_IntFill(vFanins,1,iVar1);
        iVar1 = Wlc_ObjAlloc(pNew,0x26,0,0,0);
        _k = Wlc_NtkObj(pNew,iVar1);
        Wlc_ObjAddFanins(pNew,_k,vFanins);
      }
      Vec_IntFree(p_00);
      Vec_IntFree(p_01);
      iVar1 = Wlc_ObjId(pNew,_k);
      Vec_IntFill(vFanins,1,iVar1);
      Wlc_ObjAddFanins(pNew,pConstrOut,vFanins);
      return;
    }
    p_02 = Vec_WecEntry(vConstrs,Entry);
    iVar1 = Vec_IntSize(p_02);
    if (iVar1 != 0) {
      iVar1 = Vec_IntSize(p_02);
      if (iVar1 < 2) {
        __assert_fail("Vec_IntSize(vTrace) >= 2",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlcMem.c"
                      ,0x1a4,
                      "void Wlc_NtkAbsCreateLogic(Wlc_Ntk_t *, Wlc_Ntk_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Wec_t *, Wlc_Obj_t *)"
                     );
      }
      Vec_IntClear(p_01);
      iVar1 = Vec_IntEntry(p_02,0);
      iVar2 = Vec_IntEntryLast(p_02);
      uVar3 = iVar2 >> 1 & 0x3ff;
      iVar2 = Vec_IntEntry(p_02,0);
      iVar2 = Vec_IntFind(vNodeFrames,iVar2);
      iVar4 = Vec_IntEntryLast(p_02);
      iVar4 = Vec_IntFind(vNodeFrames,iVar4);
      if ((iVar2 < 0) || (iVar4 < 0)) {
        __assert_fail("Index[0] >= 0 && Index[1] >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlcMem.c"
                      ,0x1ac,
                      "void Wlc_NtkAbsCreateLogic(Wlc_Ntk_t *, Wlc_Ntk_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Wec_t *, Wlc_Obj_t *)"
                     );
      }
      iVar5 = Vec_IntEntry(vNewObjs,iVar2 << 1);
      pDatas[1] = Wlc_NtkObj(pNew,iVar5);
      iVar5 = Vec_IntEntry(vNewObjs,iVar4 << 1);
      pWVar8 = Wlc_NtkObj(pNew,iVar5);
      iVar2 = Vec_IntEntry(vNewObjs,iVar2 * 2 + 1);
      pCond = Wlc_NtkObj(pNew,iVar2);
      iVar2 = Vec_IntEntry(vNewObjs,iVar4 * 2 + 1);
      pWVar6 = Wlc_NtkObj(pNew,iVar2);
      if ((iVar1 >> 1 & 0x3ffU) == uVar3) {
        pDatas[1] = Wlc_ObjFo2Fi(pNew,pDatas[1]);
        pCond = Wlc_ObjFo2Fi(pNew,pCond);
      }
      pWVar8 = Wlc_ObjFo2Fi(pNew,pWVar8);
      pWVar6 = Wlc_ObjFo2Fi(pNew,pWVar6);
      iVar1 = Wlc_ObjAlloc(pNew,0x1f,0,0,0);
      pWVar7 = Wlc_NtkObj(pNew,iVar1);
      iVar1 = Wlc_ObjId(pNew,pDatas[1]);
      iVar2 = Wlc_ObjId(pNew,pWVar8);
      Vec_IntFillTwo(vFanins,2,iVar1,iVar2);
      Wlc_ObjAddFanins(pNew,pWVar7,vFanins);
      iVar1 = Wlc_ObjId(pNew,pWVar7);
      Vec_IntPush(p_01,iVar1);
      iVar1 = Wlc_ObjAlloc(pNew,0x20,0,0,0);
      pWVar7 = Wlc_NtkObj(pNew,iVar1);
      iVar1 = Wlc_ObjId(pNew,pCond);
      iVar2 = Wlc_ObjId(pNew,pWVar6);
      Vec_IntFillTwo(vFanins,2,iVar1,iVar2);
      Wlc_ObjAddFanins(pNew,pWVar7,vFanins);
      iVar1 = Wlc_ObjId(pNew,pWVar7);
      Vec_IntPush(p_01,iVar1);
      for (Index[1] = 1; iVar1 = Vec_IntSize(p_02), Index[1] < iVar1 + -1; Index[1] = Index[1] + 1)
      {
        iVar1 = Vec_IntEntry(p_02,Index[1]);
        iVar2 = Vec_IntFind(vNodeFrames,iVar1);
        if (iVar2 < 0) {
          __assert_fail("Index[0] >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlcMem.c"
                        ,0x1cf,
                        "void Wlc_NtkAbsCreateLogic(Wlc_Ntk_t *, Wlc_Ntk_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Wec_t *, Wlc_Obj_t *)"
                       );
        }
        iVar4 = Vec_IntEntry(vNewObjs,iVar2 << 1);
        pDatas[1] = Wlc_NtkObj(pNew,iVar4);
        if ((iVar1 >> 1 & 0x3ffU) == uVar3) {
          pDatas[1] = Wlc_ObjFo2Fi(pNew,pDatas[1]);
        }
        iVar2 = Vec_IntEntry(vNewObjs,iVar2 * 2 + 1);
        if (iVar2 == 0) {
          pWVar6 = Wlc_NtkObj(p,iVar1 >> 0xb);
          iVar1 = Wlc_ObjType(pWVar6);
          if (iVar1 != 8) {
            __assert_fail("Wlc_ObjType(Wlc_NtkObj(p, Entry >> 11)) == WLC_OBJ_MUX",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlcMem.c"
                          ,0x1d6,
                          "void Wlc_NtkAbsCreateLogic(Wlc_Ntk_t *, Wlc_Ntk_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Wec_t *, Wlc_Obj_t *)"
                         );
          }
          iVar1 = Wlc_ObjId(pNew,pDatas[1]);
          Vec_IntPush(p_01,iVar1);
        }
        else {
          iVar1 = Wlc_ObjRange(pDatas[1]);
          iVar2 = Wlc_ObjRange(pWVar8);
          if (iVar1 != iVar2) {
            __assert_fail("Wlc_ObjRange(pAddrs[0]) == Wlc_ObjRange(pAddrs[1])",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlcMem.c"
                          ,0x1db,
                          "void Wlc_NtkAbsCreateLogic(Wlc_Ntk_t *, Wlc_Ntk_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Wec_t *, Wlc_Obj_t *)"
                         );
          }
          iVar1 = Wlc_ObjAlloc(pNew,0x20,0,0,0);
          pWVar6 = Wlc_NtkObj(pNew,iVar1);
          iVar1 = Wlc_ObjId(pNew,pDatas[1]);
          iVar2 = Wlc_ObjId(pNew,pWVar8);
          Vec_IntFillTwo(vFanins,2,iVar1,iVar2);
          Wlc_ObjAddFanins(pNew,pWVar6,vFanins);
          iVar1 = Wlc_ObjId(pNew,pWVar6);
          Vec_IntPush(p_01,iVar1);
        }
      }
      iVar1 = Vec_IntSize(p_01);
      iVar1 = Wlc_ObjAlloc(pNew,0x17,0,iVar1 + -1,0);
      pWVar8 = Wlc_NtkObj(pNew,iVar1);
      Wlc_ObjAddFanins(pNew,pWVar8,p_01);
      iVar1 = Wlc_ObjId(pNew,pWVar8);
      Vec_IntFill(vFanins,1,iVar1);
      iVar1 = Wlc_ObjAlloc(pNew,0x25,0,0,0);
      pWVar8 = Wlc_NtkObj(pNew,iVar1);
      Wlc_ObjAddFanins(pNew,pWVar8,vFanins);
      iVar1 = Wlc_ObjId(pNew,pWVar8);
      Vec_IntPush(p_00,iVar1);
    }
    Entry = Entry + 1;
  } while( true );
}

Assistant:

void Wlc_NtkAbsCreateLogic( Wlc_Ntk_t * pNew, Wlc_Ntk_t * p, Vec_Int_t * vNodeFrames, Vec_Int_t * vFanins, Vec_Int_t * vNewObjs, Vec_Wec_t * vConstrs, Wlc_Obj_t * pConstrOut ) 
{
    Vec_Int_t * vTrace; 
    Vec_Int_t * vBitConstr = Vec_IntAlloc( 100 );
    Vec_Int_t * vLevConstr = Vec_IntAlloc( 100 );
    Wlc_Obj_t * pAddrs[2], * pDatas[2], * pCond, * pConstr = NULL;
    int i, k, Entry, Index[2], iFrameLast, iFrameThis;
    assert( Vec_IntSize(vNewObjs) == 2 * Vec_IntSize(vNodeFrames) );
    Vec_WecForEachLevel( vConstrs, vTrace, i )
    {
        if ( Vec_IntSize(vTrace) == 0 ) 
            continue;
        assert( Vec_IntSize(vTrace) >= 2 );
        Vec_IntClear( vLevConstr );

        iFrameThis = (Vec_IntEntry(vTrace, 0)  >> 1) & 0x3FF;
        iFrameLast = (Vec_IntEntryLast(vTrace) >> 1) & 0x3FF;

        Index[0] = Vec_IntFind( vNodeFrames, Vec_IntEntry(vTrace, 0) );
        Index[1] = Vec_IntFind( vNodeFrames, Vec_IntEntryLast(vTrace) );
        assert( Index[0] >= 0 && Index[1] >= 0 );

        pAddrs[0] = Wlc_NtkObj( pNew, Vec_IntEntry(vNewObjs, 2*Index[0]) );
        pAddrs[1] = Wlc_NtkObj( pNew, Vec_IntEntry(vNewObjs, 2*Index[1]) );

        pDatas[0] = Wlc_NtkObj( pNew, Vec_IntEntry(vNewObjs, 2*Index[0]+1) );
        pDatas[1] = Wlc_NtkObj( pNew, Vec_IntEntry(vNewObjs, 2*Index[1]+1) );

        // redirect the source in the last time frame to point to FOs
        if ( iFrameThis == iFrameLast )
        {
            pAddrs[0] = Wlc_ObjFo2Fi(pNew, pAddrs[0]);
            pDatas[0] = Wlc_ObjFo2Fi(pNew, pDatas[0]);
        }

        // redirect the sink in the last time frame to point to FOs
        pAddrs[1] = Wlc_ObjFo2Fi(pNew, pAddrs[1]);
        pDatas[1] = Wlc_ObjFo2Fi(pNew, pDatas[1]);

        // equal addresses
        pCond = Wlc_NtkObj(pNew, Wlc_ObjAlloc(pNew, WLC_OBJ_COMP_EQU, 0, 0, 0));
        Vec_IntFillTwo( vFanins, 2, Wlc_ObjId(pNew, pAddrs[0]), Wlc_ObjId(pNew, pAddrs[1]) );
        Wlc_ObjAddFanins( pNew, pCond, vFanins );
        Vec_IntPush( vLevConstr, Wlc_ObjId(pNew, pCond) );

        // different datas
        pCond = Wlc_NtkObj(pNew, Wlc_ObjAlloc(pNew, WLC_OBJ_COMP_NOTEQU, 0, 0, 0));
        Vec_IntFillTwo( vFanins, 2, Wlc_ObjId(pNew, pDatas[0]), Wlc_ObjId(pNew, pDatas[1]) );
        Wlc_ObjAddFanins( pNew, pCond, vFanins );
        Vec_IntPush( vLevConstr, Wlc_ObjId(pNew, pCond) );

        Vec_IntForEachEntryStartStop( vTrace, Entry, k, 1, Vec_IntSize(vTrace)-1 )
        {
            iFrameThis = (Entry >> 1) & 0x3FF;
            Index[0]   = Vec_IntFind( vNodeFrames, Entry );            
            assert( Index[0] >= 0 );
            pAddrs[0]  = Wlc_NtkObj( pNew, Vec_IntEntry(vNewObjs, 2*Index[0]) );
            // redirect the middle in the last time frame to point to FOs
            if ( iFrameThis == iFrameLast )
                pAddrs[0] = Wlc_ObjFo2Fi(pNew, pAddrs[0]);
            if ( Vec_IntEntry(vNewObjs, 2*Index[0]+1) == 0 ) // MUX
            {
                assert( Wlc_ObjType(Wlc_NtkObj(p, Entry >> 11)) == WLC_OBJ_MUX );
                Vec_IntPush( vLevConstr, Wlc_ObjId(pNew, pAddrs[0]) );
            }
            else // different addresses
            {
                assert( Wlc_ObjRange(pAddrs[0]) == Wlc_ObjRange(pAddrs[1]) );
                pCond = Wlc_NtkObj(pNew, Wlc_ObjAlloc(pNew, WLC_OBJ_COMP_NOTEQU, 0, 0, 0));
                Vec_IntFillTwo( vFanins, 2, Wlc_ObjId(pNew, pAddrs[0]), Wlc_ObjId(pNew, pAddrs[1]) );
                Wlc_ObjAddFanins( pNew, pCond, vFanins );
                Vec_IntPush( vLevConstr, Wlc_ObjId(pNew, pCond) );
            }
        }

        // create last output
        pConstr = Wlc_NtkObj( pNew, Wlc_ObjAlloc(pNew, WLC_OBJ_BIT_CONCAT, 0, Vec_IntSize(vLevConstr)-1, 0) );
        Wlc_ObjAddFanins( pNew, pConstr, vLevConstr );
        Vec_IntFill( vFanins, 1, Wlc_ObjId(pNew, pConstr) );
        pConstr = Wlc_NtkObj(pNew, Wlc_ObjAlloc(pNew, WLC_OBJ_REDUCT_AND, 0, 0, 0));
        Wlc_ObjAddFanins( pNew, pConstr, vFanins );

        // save the result
        Vec_IntPush( vBitConstr, Wlc_ObjId(pNew, pConstr) );
    }
    if ( Vec_IntSize(vBitConstr) > 0 )
    {
        // create last output
        pConstr = Wlc_NtkObj(pNew, Wlc_ObjAlloc(pNew, WLC_OBJ_BIT_CONCAT, 0, Vec_IntSize(vBitConstr)-1, 0));
        Wlc_ObjAddFanins( pNew, pConstr, vBitConstr );
        // create last output
        Vec_IntFill( vFanins, 1, Wlc_ObjId(pNew, pConstr) );
        pConstr = Wlc_NtkObj(pNew, Wlc_ObjAlloc(pNew, WLC_OBJ_REDUCT_OR, 0, 0, 0));
        Wlc_ObjAddFanins( pNew, pConstr, vFanins );
    }
    else
    {
        pConstr = Wlc_NtkObj(pNew, Wlc_ObjAlloc(pNew, WLC_OBJ_CONST, 0, 0, 0));
        Vec_IntFill( vFanins, 1, 0 ); // const0 - always true
        Wlc_ObjAddFanins( pNew, pConstr, vFanins );
    }
    // cleanup
    Vec_IntFree( vBitConstr );
    Vec_IntFree( vLevConstr );
    // add the constraint as fanin to the output
    Vec_IntFill( vFanins, 1, Wlc_ObjId(pNew, pConstr) );
    Wlc_ObjAddFanins( pNew, pConstrOut, vFanins );
}